

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::train_single_example<false>
               (search *sch,bool is_test_ex,bool is_holdout_ex,multi_ex *ec_seq)

{
  int iVar1;
  undefined4 uVar2;
  shared_data *this;
  code *pcVar3;
  value_type peVar4;
  bool bVar5;
  size_t sVar6;
  reference ppeVar7;
  int **ppiVar8;
  vector<example_*,_std::allocator<example_*>_> *in_RCX;
  byte in_DL;
  byte in_SIL;
  undefined8 *in_RDI;
  int sink;
  int *__end3;
  int *__begin3;
  v_array<int> *__range3;
  bool ran_test;
  vw *all;
  search_private *priv;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  search_private *in_stack_fffffffffffffed0;
  string *psVar9;
  bool local_119;
  allocator local_e9;
  string local_e8 [32];
  char *local_c8;
  char *pcStack_c0;
  char *local_b8;
  size_t sStack_b0;
  string local_a8 [36];
  int local_84;
  int *local_80;
  int *local_78;
  v_array<int> *local_70;
  allocator local_51;
  string local_50 [39];
  undefined1 local_29;
  undefined8 *local_28;
  undefined8 *local_20;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_20 = (undefined8 *)*in_RDI;
  local_28 = (undefined8 *)*local_20;
  local_29 = 0;
  local_18 = in_RCX;
  clear_cache_hash_map((search_private *)0x3c948a);
  bVar5 = must_run_test((vw *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                        (multi_ex *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                        false);
  if (bVar5) {
    local_29 = 1;
    reset_search_structure(in_stack_fffffffffffffed0);
    *(undefined4 *)((long)local_20 + 0x6c) = 1;
    bVar5 = might_print_update((vw *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    local_119 = true;
    if (!bVar5) {
      sVar6 = v_array<int>::size((v_array<int> *)(local_28 + 0x6a2));
      local_119 = true;
      if (sVar6 == 0) {
        local_119 = 0 < *(int *)(local_28 + 0x6a6);
      }
    }
    *(bool *)((long)local_20 + 0x271) = local_119;
    psVar9 = (string *)local_20[0x4f];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"",&local_51);
    std::__cxx11::stringstream::str(psVar9);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3c95c3);
    run_task((search *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (multi_ex *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    if ((local_9 & 1) == 0) {
      this = (shared_data *)*local_28;
      ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
      shared_data::update(this,(bool)((*ppeVar7)->test_only & 1),(bool)((local_9 ^ 0xff) & 1),
                          *(float *)((long)local_20 + 0x244),1.0,local_20[0x57]);
    }
    local_70 = (v_array<int> *)(local_28 + 0x6a2);
    ppiVar8 = v_array<int>::begin(local_70);
    local_78 = *ppiVar8;
    ppiVar8 = v_array<int>::end(local_70);
    local_80 = *ppiVar8;
    for (; local_78 != local_80; local_78 = local_78 + 1) {
      iVar1 = *local_78;
      pcVar3 = (code *)local_28[0x6a8];
      local_84 = iVar1;
      std::__cxx11::stringstream::str();
      ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
      peVar4 = *ppeVar7;
      local_c8 = (peVar4->tag)._begin;
      pcStack_c0 = (peVar4->tag)._end;
      local_b8 = (peVar4->tag).end_array;
      sStack_b0 = (peVar4->tag).erase_count;
      (*pcVar3)(iVar1,local_a8);
      std::__cxx11::string::~string(local_a8);
    }
    if (0 < *(int *)(local_28 + 0x6a6)) {
      pcVar3 = (code *)local_28[0x6a8];
      uVar2 = *(undefined4 *)(local_28 + 0x6a6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"",&local_e9);
      std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
      (*pcVar3)(uVar2,local_e8);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
  }
  return;
}

Assistant:

void train_single_example(search& sch, bool is_test_ex, bool is_holdout_ex, multi_ex& ec_seq)
{
  search_private& priv = *sch.priv;
  vw& all = *priv.all;
  bool ran_test = false;  // we must keep track so that even if we skip test, we still update # of examples seen

  // if (! priv.no_caching)
  clear_cache_hash_map(priv);

  cdbg << "is_test_ex=" << is_test_ex << " vw_is_main=" << all.vw_is_main << endl;
  cdbg << "must_run_test = " << must_run_test(all, ec_seq, is_test_ex) << endl;
  // do an initial test pass to compute output (and loss)
  if (must_run_test(all, ec_seq, is_test_ex))
  {
    cdbg << "======================================== INIT TEST (" << priv.current_policy << ","
         << priv.read_example_last_pass << ") ========================================" << endl;

    ran_test = true;

    // do the prediction
    reset_search_structure(priv);
    priv.state = INIT_TEST;
    priv.should_produce_string =
        might_print_update(all) || (all.final_prediction_sink.size() > 0) || (all.raw_prediction > 0);
    priv.pred_string->str("");
    priv.test_action_sequence.clear();
    run_task(sch, ec_seq);

    // accumulate loss
    if (!is_test_ex)
      all.sd->update(ec_seq[0]->test_only, !is_test_ex, priv.test_loss, 1.f, priv.num_features);

    // generate output
    for (int sink : all.final_prediction_sink) all.print_text((int)sink, priv.pred_string->str(), ec_seq[0]->tag);

    if (all.raw_prediction > 0)
      all.print_text(all.raw_prediction, "", ec_seq[0]->tag);
  }

  // if we're not training, then we're done!
  if ((!is_learn) || is_test_ex || is_holdout_ex || ec_seq[0]->test_only || (!priv.all->training))
    return;

  // SPEEDUP: if the oracle was never called, we can skip this!

  // do a pass over the data allowing oracle
  cdbg << "======================================== INIT TRAIN (" << priv.current_policy << ","
       << priv.read_example_last_pass << ") ========================================" << endl;
  // cerr << "training" << endl;

  clear_cache_hash_map(priv);
  reset_search_structure(priv);
  clear_memo_foreach_action(priv);
  priv.state = INIT_TRAIN;
  priv.active_uncertainty.clear();
  priv.train_trajectory.clear();  // this is where we'll store the training sequence
  run_task(sch, ec_seq);

  if (!ran_test)  // was  && !priv.ec_seq[0]->test_only) { but we know it's not test_only
    all.sd->update(ec_seq[0]->test_only, true, priv.test_loss, 1.f, priv.num_features);

  // if there's nothing to train on, we're done!
  if ((priv.loss_declared_cnt == 0) || (priv.t + priv.meta_t == 0) ||
      (priv.rollout_method == NO_ROLLOUT))  // TODO: make sure NO_ROLLOUT works with beam!
  {
    return;
  }

  // otherwise, we have some learn'in to do!
  cdbg << "======================================== LEARN (" << priv.current_policy << ","
       << priv.read_example_last_pass << ") ========================================" << endl;
  priv.T = priv.metatask ? priv.meta_t : priv.t;
  get_training_timesteps(priv, priv.timesteps);
  cdbg << "train_trajectory.size() = " << priv.train_trajectory.size() << ":\t";
  cdbg_print_array<scored_action>("", priv.train_trajectory);
  // cdbg << "memo_foreach_action = " << priv.memo_foreach_action << endl;
  for (size_t i = 0; i < priv.memo_foreach_action.size(); i++)
  {
    cdbg << "memo_foreach_action[" << i << "] = ";
    if (priv.memo_foreach_action[i])
      cdbg << *priv.memo_foreach_action[i];
    else
      cdbg << "null";
    cdbg << endl;
  }

  if (priv.cb_learner)
    priv.learn_losses.cb.costs.clear();
  else
    priv.learn_losses.cs.costs.clear();

  for (size_t tid = 0; tid < priv.timesteps.size(); tid++)
  {
    cdbg << "timestep = " << priv.timesteps[tid] << " [" << tid << "/" << priv.timesteps.size() << "]" << endl;

    if (priv.metatask && !priv.memo_foreach_action[tid])
    {
      cdbg << "skipping because it looks like this was overridden by metatask" << endl;
      continue;
    }

    priv.learn_ec_ref = nullptr;
    priv.learn_ec_ref_cnt = 0;

    reset_search_structure(priv);  // TODO remove this?
    bool skipped_all_actions = true;
    priv.learn_a_idx = 0;
    priv.done_with_all_actions = false;
    // for each action, roll out to get a loss
    while (!priv.done_with_all_actions)
    {
      priv.learn_t = priv.timesteps[tid];
      advance_from_known_actions(priv);
      if (priv.done_with_all_actions)
        break;

      skipped_all_actions = false;
      reset_search_structure(priv);

      priv.state = LEARN;
      priv.learn_t = priv.timesteps[tid];
      cdbg << "-------------------------------------------------------------------------------------" << endl;
      cdbg << "learn_t = " << priv.learn_t << ", learn_a_idx = " << priv.learn_a_idx << endl;
      // cdbg_print_array("priv.active_known[learn_t]", priv.active_known[priv.learn_t]);
      run_task(sch, ec_seq);
      // cerr_print_array("in GENER, learn_allowed_actions", priv.learn_allowed_actions);
      float this_loss = priv.learn_loss;
      cs_cost_push_back(priv.cb_learner, priv.learn_losses,
          priv.is_ldf ? (uint32_t)(priv.learn_a_idx - 1) : (uint32_t)priv.learn_a_idx, this_loss);
      //                          (priv.learn_allowed_actions.size() > 0) ?
      //                          priv.learn_allowed_actions[priv.learn_a_idx-1] : priv.is_ldf ? (priv.learn_a_idx-1) :
      //                          (priv.learn_a_idx),
      //                           priv.learn_loss);
    }
    if (priv.active_csoaa_verify > 0.)
      verify_active_csoaa(
          priv.learn_losses.cs, priv.active_known[priv.learn_t], ec_seq[0]->example_counter, priv.active_csoaa_verify);

    if (skipped_all_actions)
    {
      reset_search_structure(priv);
      priv.state = LEARN;
      priv.learn_t = priv.timesteps[tid];
      priv.force_setup_ec_ref = true;
      cdbg << "<<<<<" << endl;
      cdbg << "skipped all actions; learn_t = " << priv.learn_t << ", learn_a_idx = " << priv.learn_a_idx << endl;
      run_task(sch, ec_seq);  // TODO: i guess we can break out of this early
      cdbg << ">>>>>" << endl;
    }
    else
      cdbg << "didn't skip all actions" << endl;

    // now we can make a training example
    if (priv.learn_allowed_actions.size() > 0)
    {
      for (size_t i = 0; i < priv.learn_allowed_actions.size(); i++)
      {
        priv.learn_losses.cs.costs[i].class_index = priv.learn_allowed_actions[i];
      }
    }
    // float min_loss = 0.;
    // if (priv.metatask)
    //  for (size_t aid=0; aid<priv.memo_foreach_action[tid]->size(); aid++)
    //    min_loss = MIN(min_loss, priv.memo_foreach_action[tid]->get(aid).cost);
    cdbg << "priv.learn_losses = [";
    for (auto& wc : priv.learn_losses.cs.costs) cdbg << " " << wc.class_index << ":" << wc.x;
    cdbg << " ]" << endl;
    cdbg << "gte" << endl;
    generate_training_example(priv, priv.learn_losses, 1., true);  // , min_loss);  // TODO: weight
    if (!priv.examples_dont_change)
      for (size_t n = 0; n < priv.learn_ec_copy.size(); n++)
      {
        if (sch.priv->is_ldf)
          CS::cs_label.delete_label(&priv.learn_ec_copy[n].l.cs);
        else
          MC::mc_label.delete_label(&priv.learn_ec_copy[n].l.multi);
      }
    if (priv.cb_learner)
      priv.learn_losses.cb.costs.clear();
    else
      priv.learn_losses.cs.costs.clear();
  }

  if (priv.active_csoaa && (priv.save_every_k_runs > 1))
  {
    size_t prev_num = priv.num_calls_to_run_previous / priv.save_every_k_runs;
    size_t this_num = priv.num_calls_to_run / priv.save_every_k_runs;
    if (this_num > prev_num)
      save_predictor(all, all.final_regressor_name, this_num);
    priv.num_calls_to_run_previous = priv.num_calls_to_run;
  }
}